

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

Nullable<CordRep_*> absl::lts_20250127::VerifyTree(Nullable<CordRep_*> node)

{
  byte bVar1;
  uint uVar2;
  reference ppCVar3;
  Nonnull<CordRep_*> pCVar4;
  int iVar5;
  Nonnull<CordRep_*> unaff_R14;
  string death_message;
  InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  worklist;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  Nonnull<CordRep_*> local_50;
  void *local_48;
  long local_40;
  Nullable<CordRep_*> local_38;
  
  if (node != (Nullable<CordRep_*>)0x0) {
    local_50 = (Nonnull<CordRep_*>)0x0;
    local_38 = node;
    inlined_vector_internal::
    Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
    ::EmplaceBack<absl::lts_20250127::cord_internal::CordRep*const&>
              ((Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
                *)&local_50,&local_38);
    do {
      ppCVar3 = InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                ::back((InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                        *)&local_50);
      if (local_50 < (Nonnull<CordRep_*>)0x2) {
        pCVar4 = local_50;
        VerifyTree();
LAB_0029e28d:
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"Check node != nullptr failed: ","");
        ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,unaff_R14,pCVar4);
        std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                  (3,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                   ,0x5f3,local_70);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                      ,0x5f3,
                      "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)");
      }
      unaff_R14 = *ppCVar3;
      pCVar4 = (Nonnull<CordRep_*>)(local_50[-1].storage + 1);
      local_50 = pCVar4;
      if (unaff_R14 == (Nonnull<CordRep_*>)0x0) goto LAB_0029e28d;
      if (unaff_R14 != node) {
        if (unaff_R14->length == 0) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Check node->length != 0 failed: ","");
          ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,unaff_R14,pCVar4);
          std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5f5,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5f5,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
        if (unaff_R14->tag == '\x02') {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Check !node->IsCrc() failed: ","");
          ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,unaff_R14,pCVar4);
          std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5f6,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5f6,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
      bVar1 = unaff_R14->tag;
      uVar2 = (uint)bVar1;
      if (bVar1 < 6) {
        if (bVar1 == 1) {
          pCVar4 = (Nonnull<CordRep_*>)**(ulong **)&unaff_R14[1].refcount;
          if (pCVar4 <= (Nonnull<CordRep_*>)unaff_R14[1].length) {
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,
                       "Check node->substring()->start < node->substring()->child->length failed: ",
                       "");
            ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,unaff_R14,pCVar4);
            std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                      (3,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                       ,0x602,local_70);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                          ,0x602,
                          "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                         );
          }
          if (pCVar4 < (Nonnull<CordRep_*>)
                       (((Nonnull<CordRep_*>)unaff_R14[1].length)->storage +
                       (unaff_R14->length - 0xd))) {
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,
                       "Check node->substring()->start + node->length <= node->substring()->child->length failed: "
                       ,"");
            ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,unaff_R14,pCVar4);
            std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                      (3,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                       ,0x605,local_70);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                          ,0x605,
                          "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                         );
          }
        }
        else if (uVar2 == 2) {
          pCVar4 = (Nonnull<CordRep_*>)unaff_R14[1].length;
          if (pCVar4 == (Nonnull<CordRep_*>)0x0) {
            if (unaff_R14->length != 0) {
              local_70[0] = local_60;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_70,
                         "Check node->crc()->child != nullptr || node->crc()->length == 0 failed: ",
                         "");
              ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,unaff_R14,pCVar4);
              std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                        (3,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                         ,0x609,local_70);
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                            ,0x609,
                            "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                           );
            }
          }
          else {
            if (unaff_R14->length != pCVar4->length) {
              local_70[0] = local_60;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_70,
                         "Check node->crc()->length == node->crc()->child->length failed: ","");
              ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,unaff_R14,pCVar4);
              std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                        (3,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                         ,0x60c,local_70);
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                            ,0x60c,
                            "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                           );
            }
            unaff_R14 = unaff_R14 + 1;
            inlined_vector_internal::
            Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
            ::EmplaceBack<absl::lts_20250127::cord_internal::CordRep*const&>
                      ((Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
                        *)&local_50,(CordRep **)unaff_R14);
          }
        }
        else if ((uVar2 == 5) && (unaff_R14[1].length == 0)) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Check node->external()->base != nullptr failed: ","");
          ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,unaff_R14,pCVar4);
          std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5fe,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5fe,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
      else {
        if ((bVar1 - 0xf9 < 7) || (uVar2 < 6)) {
          __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                        ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
        }
        iVar5 = -0xb8000;
        if (bVar1 < 0xbb) {
          iVar5 = -0xe80;
        }
        pCVar4 = (Nonnull<CordRep_*>)0xc;
        if (bVar1 < 0xbb) {
          pCVar4 = (Nonnull<CordRep_*>)&DAT_00000006;
        }
        if (bVar1 < 0x43) {
          iVar5 = -0x10;
          pCVar4 = (Nonnull<CordRep_*>)0x3;
        }
        if ((ulong)(long)(int)((uVar2 << (sbyte)pCVar4) + iVar5 + -0xd) < unaff_R14->length) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Check node->length <= node->flat()->Capacity() failed: ",""
                    );
          ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,unaff_R14,pCVar4);
          std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5fb,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5fb,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
    } while ((Nonnull<CordRep_*>)0x1 < local_50);
    if (local_50 != (Nonnull<CordRep_*>)0x0) {
      operator_delete(local_48,local_40 << 3);
    }
  }
  return node;
}

Assistant:

static inline absl::Nullable<CordRep*> VerifyTree(
    absl::Nullable<CordRep*> node) {
  assert(node == nullptr || VerifyNode(node, node));
  static_cast<void>(&VerifyNode);
  return node;
}